

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QRhiScissor *s)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  QDebug *pQVar4;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)s);
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  *(undefined1 *)(*(long *)(s->m_rect)._M_elems + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)s,"QRhiScissor(bottom-left-x=");
  pQVar4 = QDebug::operator<<(pQVar4,(int)uVar2);
  pQVar4 = QDebug::operator<<(pQVar4," bottom-left-y=");
  pQVar4 = QDebug::operator<<(pQVar4,(int)((ulong)uVar2 >> 0x20));
  pQVar4 = QDebug::operator<<(pQVar4," width=");
  pQVar4 = QDebug::operator<<(pQVar4,(int)uVar3);
  pQVar4 = QDebug::operator<<(pQVar4," height=");
  pQVar4 = QDebug::operator<<(pQVar4,(int)((ulong)uVar3 >> 0x20));
  QDebug::operator<<(pQVar4,')');
  uVar2 = *(undefined8 *)(s->m_rect)._M_elems;
  (s->m_rect)._M_elems[0] = 0;
  (s->m_rect)._M_elems[1] = 0;
  *(undefined8 *)dbg.stream = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiScissor &s)
{
    QDebugStateSaver saver(dbg);
    const std::array<int, 4> r = s.scissor();
    dbg.nospace() << "QRhiScissor(bottom-left-x=" << r[0]
                  << " bottom-left-y=" << r[1]
                  << " width=" << r[2]
                  << " height=" << r[3]
                  << ')';
    return dbg;
}